

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ScaleWindow(ImGuiWindow *window,float scale)

{
  ImVec2 IVar1;
  ImVec2 local_70 [2];
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 local_28;
  ImVec2 local_20;
  ImVec2 origin;
  float scale_local;
  ImGuiWindow *window_local;
  
  local_20 = (window->Viewport->super_ImGuiViewport).Pos;
  origin.y = scale;
  local_40 = operator-(&window->Pos,&local_20);
  local_38 = operator*(&local_40,origin.y);
  local_30 = operator+(&local_38,&local_20);
  local_28 = ImFloor(&local_30);
  window->Pos = local_28;
  local_50 = operator*(&window->Size,origin.y);
  local_48 = ImFloor(&local_50);
  window->Size = local_48;
  local_60 = operator*(&window->SizeFull,origin.y);
  local_58 = ImFloor(&local_60);
  window->SizeFull = local_58;
  local_70[0] = operator*(&window->ContentSize,origin.y);
  IVar1 = ImFloor(local_70);
  window->ContentSize = IVar1;
  return;
}

Assistant:

static void ScaleWindow(ImGuiWindow* window, float scale)
{
    ImVec2 origin = window->Viewport->Pos;
    window->Pos = ImFloor((window->Pos - origin) * scale + origin);
    window->Size = ImFloor(window->Size * scale);
    window->SizeFull = ImFloor(window->SizeFull * scale);
    window->ContentSize = ImFloor(window->ContentSize * scale);
}